

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

void Kf_ManPrintStats(Kf_Man_t *p,char *pTitle)

{
  abctime aVar1;
  abctime time;
  char *pStr;
  
  if (p->pPars->fVerbose != 0) {
    printf("%s :  ");
    printf("Level =%6lu   ",p->pPars->Delay);
    printf("Area =%9lu   ",p->pPars->Area);
    pStr = (char *)p->pPars->Edge;
    printf("Edge =%9lu   ");
    aVar1 = Abc_Clock();
    Abc_PrintTime((int)aVar1 - (int)p->clkStart,pStr,time);
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void Kf_ManPrintStats( Kf_Man_t * p, char * pTitle )
{
    if ( !p->pPars->fVerbose )
        return;
    printf( "%s :  ", pTitle );
    printf( "Level =%6lu   ", (long)p->pPars->Delay );
    printf( "Area =%9lu   ",  (long)p->pPars->Area );
    printf( "Edge =%9lu   ",  (long)p->pPars->Edge );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}